

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall Minisat::Solver::simplify(Solver *this)

{
  CRef CVar1;
  int iVar2;
  long in_RDI;
  Solver *unaff_retaddr;
  uint in_stack_00000014;
  vec<unsigned_int> *in_stack_00000018;
  Solver *in_stack_00000020;
  Solver *in_stack_00000240;
  
  reset_old_trail(unaff_retaddr);
  if (((*(byte *)(in_RDI + 0x228) & 1) == 0) ||
     (CVar1 = propagate(in_stack_00000240), CVar1 != 0xffffffff)) {
    *(undefined1 *)(in_RDI + 0x228) = 0;
    return false;
  }
  iVar2 = nAssigns((Solver *)0x136450);
  if ((iVar2 != *(int *)(in_RDI + 0x3b0)) && (*(long *)(in_RDI + 0x3b8) < 1)) {
    removeSatisfied(in_stack_00000020,in_stack_00000018);
    safeRemoveSatisfied(in_stack_00000020,in_stack_00000018,in_stack_00000014);
    safeRemoveSatisfied(in_stack_00000020,in_stack_00000018,in_stack_00000014);
    if ((*(byte *)(in_RDI + 0x490) & 1) != 0) {
      removeSatisfied(in_stack_00000020,in_stack_00000018);
    }
    checkGarbage((Solver *)0x1364dd);
    rebuildOrderHeap(unaff_retaddr);
    iVar2 = nAssigns((Solver *)0x1364ef);
    *(int *)(in_RDI + 0x3b0) = iVar2;
    *(long *)(in_RDI + 0x3b8) = *(long *)(in_RDI + 0x108) + *(long *)(in_RDI + 0x110);
    return true;
  }
  return true;
}

Assistant:

bool Solver::simplify()
{
    TRACE(std::cout << "c run simplify on level " << decisionLevel() << std::endl);
    assert(decisionLevel() == 0);

    reset_old_trail();

    if (!ok || propagate() != CRef_Undef) return ok = false;

    if (nAssigns() == simpDB_assigns || (simpDB_props > 0)) return true;

    // Remove satisfied clauses:
    removeSatisfied(learnts_core); // Should clean core first.
    safeRemoveSatisfied(learnts_tier2, TIER2);
    safeRemoveSatisfied(learnts_local, LOCAL);
    if (remove_satisfied) // Can be turned off.
        removeSatisfied(clauses);
    checkGarbage();
    rebuildOrderHeap();

    simpDB_assigns = nAssigns();
    simpDB_props = clauses_literals + learnts_literals; // (shouldn't depend on stats really, but it will do for now)

    TRACE(std::cout << "c finished simplify on level " << decisionLevel() << std::endl);
    return true;
}